

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_identify(FFFuncs *ff,char *name,void *p,lword plen,uchar class,uchar endian,uint16_t machine
                ,uint32_t ver)

{
  uint be;
  uint16_t uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  int iVar7;
  undefined3 in_register_00000089;
  ar_info ai;
  ar_info local_168;
  
  iVar4 = 0;
  iVar7 = 0;
  if (0x17 < (ulong)plen) {
    bVar2 = ar_init(&local_168,(char *)p,plen,name);
    if ((bVar2 == 0) || (bVar3 = ar_extract(&local_168), p = local_168.data, bVar3 != 0)) {
      iVar7 = iVar4;
      if (((0x33 < (ulong)plen || class != '\x01') &&
          (((0x3f < (ulong)plen || class != '\x02' &&
            (iVar4 = strncmp((char *)p,ELFid,4), iVar4 == 0)) && (*(uchar *)((long)p + 4) == class))
          )) && ((*(uchar *)((long)p + 5) == endian && (*(uint8_t *)((long)p + 6) == (uint8_t)ver)))
         ) {
        be = (uint)(CONCAT31(in_register_00000089,endian) == 2);
        uVar5 = read32(be,(uint8_t *)((long)p + 0x14));
        if ((uVar5 == ver) && (uVar1 = read16(be,(uint8_t *)((long)p + 0x12)), uVar1 == machine)) {
          uVar1 = read16(be,(uint8_t *)((long)p + 0x10));
          if (uVar1 == 3) {
            iVar7 = 4;
            if (bVar2 == 0) {
              return 4;
            }
            pcVar6 = ff->tname;
            iVar4 = 0x27;
          }
          else if (uVar1 == 2) {
            iVar7 = 2;
            if (bVar2 == 0) {
              return 2;
            }
            pcVar6 = ff->tname;
            iVar4 = 0x28;
          }
          else {
            if (uVar1 == 1) {
              if (bVar2 != 0) {
                return 8;
              }
              return 1;
            }
            pcVar6 = ff->tname;
            iVar7 = 0;
            iVar4 = 0x29;
          }
          error(iVar4,name,pcVar6);
        }
      }
    }
    else {
      error(0x26,name);
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

int elf_identify(struct FFFuncs *ff,char *name,void *p,
                 lword plen,unsigned char class,
                 unsigned char endian,uint16_t machine,uint32_t ver)
/* check a possible ELF file against the requirements, then */
/* return its type (object, library, shared object) */
{
  bool arflag = FALSE;
  bool be = (endian == ELFDATA2MSB);
  struct Elf_CommonHdr *hdr;
  struct ar_info ai;

  if (plen < sizeof(struct Elf_CommonHdr))
    return ID_UNKNOWN;

  if (ar_init(&ai,(char *)p,plen,name)) {
    /* library archive detected, extract 1st archive member */
    arflag = TRUE;
    if (!(ar_extract(&ai))) {
      error(38,name);  /* Empty archive ignored */
      return ID_IGNORE;
    }
    hdr = (struct Elf_CommonHdr *)ai.data;
  }
  else
    hdr = (struct Elf_CommonHdr *)p;

  if ((class==ELFCLASS32 && plen < sizeof(struct Elf32_Ehdr)) ||
      (class==ELFCLASS64 && plen < sizeof(struct Elf64_Ehdr)))
    return ID_UNKNOWN;

  if (!strncmp((char *)hdr->e_ident,ELFid,4)) {
    /* ELF identification found */
    if (hdr->e_ident[EI_CLASS]==class && hdr->e_ident[EI_DATA]==endian &&
        hdr->e_ident[EI_VERSION]==(unsigned char)ver &&
        read32(be,hdr->e_version)==ver && read16(be,hdr->e_machine)==machine) {
      switch (read16(be,hdr->e_type)) {
        case ET_REL:
          return arflag ? ID_LIBARCH : ID_OBJECT;
        case ET_EXEC:
          if (arflag) /* no executables in library archives */
            error(40,name,ff->tname);
          return ID_EXECUTABLE;
        case ET_DYN:
          if (arflag) /* no shared objects in library archives */
            error(39,name,ff->tname);
          return ID_SHAREDOBJ;
        default:
          error(41,name,ff->tname);  /* illegal fmt. / file corrupted */
          break;
      }
    }
  }

  return ID_UNKNOWN;
}